

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O2

void __thiscall btMatrixX<float>::setIdentity(btMatrixX<float> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  int iVar5;
  long lVar6;
  
  setZero(this);
  iVar1 = this->m_rows;
  iVar2 = this->m_cols;
  iVar3 = this->m_setElemOperations;
  pfVar4 = (this->m_storage).m_data;
  iVar5 = 0;
  for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
    this->m_setElemOperations = iVar3 + 1 + (int)lVar6;
    pfVar4[iVar5] = 1.0;
    iVar5 = iVar5 + iVar2 + 1;
  }
  return;
}

Assistant:

void setIdentity()
	{
		btAssert(rows() == cols());
		
		setZero();
		for (int row=0;row<rows();row++)
		{
			setElem(row,row,1);
		}
	}